

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void __thiscall btLCP::pN_equals_ANC_times_qC(btLCP *this,btScalar *p,btScalar *q)

{
  int iVar1;
  int iVar2;
  btScalar **ppbVar3;
  uint uVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  
  iVar1 = this->m_nN;
  if (0 < (long)iVar1) {
    iVar2 = this->m_nC;
    ppbVar3 = this->m_A;
    lVar7 = 0;
    do {
      pfVar8 = ppbVar3[iVar2 + lVar7];
      fVar9 = 0.0;
      uVar4 = iVar2 - 2U;
      pfVar5 = q;
      for (iVar6 = iVar2; 1 < iVar6; iVar6 = iVar6 + -2) {
        fVar9 = (float)((ulong)*(undefined8 *)pfVar5 >> 0x20) *
                (float)((ulong)*(undefined8 *)pfVar8 >> 0x20) +
                fVar9 + (float)*(undefined8 *)pfVar5 * (float)*(undefined8 *)pfVar8;
        pfVar8 = pfVar8 + 2;
        pfVar5 = pfVar5 + 2;
        uVar4 = (iVar2 - (iVar2 - 2U & 0xfffffffe)) - 4;
      }
      if (uVar4 == 0xffffffff) {
        fVar9 = fVar9 + *pfVar8 * *pfVar5;
      }
      p[iVar2 + lVar7] = fVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void btLCP::pN_equals_ANC_times_qC (btScalar *p, btScalar *q)
{
  // we could try to make this matrix-vector multiplication faster using
  // outer product matrix tricks, e.g. with the dMultidotX() functions.
  // but i tried it and it actually made things slower on random 100x100
  // problems because of the overhead involved. so we'll stick with the
  // simple method for now.
  const int nC = m_nC;
  btScalar *ptgt = p + nC;
  const int nN = m_nN;
  for (int i=0; i<nN; ++i) {
    ptgt[i] = btLargeDot (BTAROW(i+nC),q,nC);
  }
}